

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClass.c
# Opt level: O2

void Fra_ClassesSelectRepr(Fra_Cla_t *p)

{
  long *plVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  int i;
  long lVar7;
  int iVar8;
  ulong uVar9;
  
  i = 0;
  do {
    if (p->vClasses->nSize <= i) {
      return;
    }
    plVar3 = (long *)Vec_PtrEntry(p->vClasses,i);
    iVar8 = 1000000000;
    uVar9 = 0xffffffffffffffff;
    lVar7 = 0;
    for (uVar6 = 0; (Aig_Obj_t *)plVar3[uVar6] != (Aig_Obj_t *)0x0; uVar6 = uVar6 + 1) {
      iVar2 = Aig_SupportSize(p->pAig,(Aig_Obj_t *)plVar3[uVar6]);
      if (iVar2 < iVar8) {
        lVar4 = plVar3[uVar6];
LAB_00731651:
        uVar9 = uVar6 & 0xffffffff;
        lVar7 = lVar4;
        iVar8 = iVar2;
      }
      else if ((iVar8 == iVar2) &&
              (lVar4 = plVar3[uVar6],
              (*(uint *)(lVar4 + 0x1c) & 0xffffff) < (*(uint *)(lVar7 + 0x1c) & 0xffffff)))
      goto LAB_00731651;
    }
    if ((int)uVar9 != 0) {
      plVar3[(int)uVar9] = *plVar3;
      *plVar3 = lVar7;
      lVar4 = 1;
      while (lVar7 != 0) {
        if (lVar4 == 1) {
          lVar5 = 0;
        }
        else {
          lVar5 = *plVar3;
        }
        *(long *)(*(long *)(*(long *)(*(long *)(lVar7 + 0x28) + 0x30) + 8) +
                 (long)*(int *)(lVar7 + 0x24) * 8) = lVar5;
        plVar1 = plVar3 + lVar4;
        lVar4 = lVar4 + 1;
        lVar7 = *plVar1;
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

void Fra_ClassesSelectRepr( Fra_Cla_t * p )
{
    Aig_Obj_t ** pClass, * pNodeMin;
    int i, c, cMinSupp, nSuppSizeMin, nSuppSizeCur;
    // reassign representatives in each class
    Vec_PtrForEachEntry( Aig_Obj_t **, p->vClasses, pClass, i )
    {
        // collect support sizes and find the min-support node
        cMinSupp = -1;
        pNodeMin = NULL;
        nSuppSizeMin = ABC_INFINITY;
        for ( c = 0; pClass[c]; c++ )
        {
            nSuppSizeCur = Aig_SupportSize( p->pAig, pClass[c] );
//            nSuppSizeCur = 1;
            if ( nSuppSizeMin > nSuppSizeCur || 
                (nSuppSizeMin == nSuppSizeCur && pNodeMin->Level > pClass[c]->Level) )
            {
                nSuppSizeMin = nSuppSizeCur;
                pNodeMin = pClass[c];
                cMinSupp = c; 
            }
        }
        // skip the case when the repr did not change
        if ( cMinSupp == 0 )
            continue;
        // make the new node the representative of the class
        pClass[cMinSupp] = pClass[0];
        pClass[0] = pNodeMin;
        // set the representative
        for ( c = 0; pClass[c]; c++ )
            Fra_ClassObjSetRepr( pClass[c], c? pClass[0] : NULL );
    }
}